

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

ALLEGRO_THREAD *
al_create_thread_with_stacksize
          (_func_void_ptr_ALLEGRO_THREAD_ptr_void_ptr *proc,void *arg,size_t stacksize)

{
  ALLEGRO_THREAD *thread;
  
  thread = create_thread();
  thread->thread_state = THREAD_STATE_CREATED;
  _al_mutex_init(&thread->mutex);
  _al_cond_init(&thread->cond);
  thread->arg = arg;
  thread->proc = proc;
  _al_thread_create_with_stacksize(&thread->thread,thread_func_trampoline,thread,stacksize);
  return thread;
}

Assistant:

ALLEGRO_THREAD *al_create_thread_with_stacksize(
   void *(*proc)(ALLEGRO_THREAD *thread, void *arg), void *arg, size_t stacksize)
{
   ALLEGRO_THREAD *outer = create_thread();
   outer->thread_state = THREAD_STATE_CREATED;
   _al_mutex_init(&outer->mutex);
   _al_cond_init(&outer->cond);
   outer->arg = arg;
   outer->proc = proc;
   _al_thread_create_with_stacksize(&outer->thread, thread_func_trampoline, outer, stacksize);
   /* XXX _al_thread_create should return an error code */
   return outer;
}